

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereLoopClearUnion(sqlite3 *db,WhereLoop *p)

{
  WhereLoop *p_local;
  sqlite3 *db_local;
  
  if ((p->wsFlags & 0x4400) != 0) {
    if (((p->wsFlags & 0x400) == 0) || ((p->u).vtab.needFree == '\0')) {
      if (((p->wsFlags & 0x4000) != 0) && ((p->u).btree.pIndex != (Index *)0x0)) {
        sqlite3DbFree(db,((p->u).btree.pIndex)->zColAff);
        sqlite3DbFreeNN(db,(p->u).btree.pIndex);
        (p->u).btree.pIndex = (Index *)0x0;
      }
    }
    else {
      sqlite3_free((p->u).btree.pIndex);
      (p->u).vtab.needFree = '\0';
      (p->u).btree.pIndex = (Index *)0x0;
    }
  }
  return;
}

Assistant:

static void whereLoopClearUnion(sqlite3 *db, WhereLoop *p){
  if( p->wsFlags & (WHERE_VIRTUALTABLE|WHERE_AUTO_INDEX) ){
    if( (p->wsFlags & WHERE_VIRTUALTABLE)!=0 && p->u.vtab.needFree ){
      sqlite3_free(p->u.vtab.idxStr);
      p->u.vtab.needFree = 0;
      p->u.vtab.idxStr = 0;
    }else if( (p->wsFlags & WHERE_AUTO_INDEX)!=0 && p->u.btree.pIndex!=0 ){
      sqlite3DbFree(db, p->u.btree.pIndex->zColAff);
      sqlite3DbFreeNN(db, p->u.btree.pIndex);
      p->u.btree.pIndex = 0;
    }
  }
}